

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8.c
# Opt level: O2

utf8_size_t utf8_wrap_length(utf8_char_t *data,utf8_size_t size)

{
  int iVar1;
  size_t sVar2;
  utf8_size_t uVar3;
  utf8_size_t uVar4;
  ulong uVar5;
  
  uVar5 = 0;
  uVar3 = size;
  while ((uVar4 = uVar3, uVar5 <= size && (sVar2 = _utf8_newline(data), uVar4 = uVar5, sVar2 == 0)))
  {
    iVar1 = utf8_char_whitespace(data);
    if (iVar1 != 0) {
      uVar3 = uVar5;
    }
    sVar2 = utf8_char_length(data);
    data = data + sVar2;
    uVar5 = uVar5 + 1;
  }
  return uVar4;
}

Assistant:

utf8_size_t utf8_wrap_length(const utf8_char_t* data, utf8_size_t size)
{
    // Set split_at to size, so if a split point cna not be found, retuns the size passed in
    size_t char_length, char_count, split_at = size;

    for (char_count = 0; char_count <= size; ++char_count) {
        if (_utf8_newline(data)) {
            return char_count;
        } else if (utf8_char_whitespace(data)) {
            split_at = char_count;
        }

        char_length = utf8_char_length(data);
        data += char_length;
    }

    return split_at;
}